

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

qint64 __thiscall QFSFileEnginePrivate::writeFdFh(QFSFileEnginePrivate *this,char *data,qint64 len)

{
  long lVar1;
  QAbstractFileEngine *this_00;
  size_t sVar2;
  int *piVar3;
  qint64 qVar4;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags;
  long in_RDX;
  long in_RSI;
  QFSFileEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  UnsignedIOType chunkSize;
  quint64 wantedBytes;
  SignedIOType result_1;
  size_t result;
  qint64 writtenBytes;
  QFSFileEngine *q;
  MetaDataFlag in_stack_ffffffffffffff3c;
  QFileSystemMetaData *in_stack_ffffffffffffff40;
  void *in_stack_ffffffffffffff48;
  FileError error;
  QAbstractFileEngine *in_stack_ffffffffffffff50;
  long local_70;
  qint64 local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &q_func(in_RDI)->super_QAbstractFileEngine;
  if (in_RDX < 0) {
    QSystemError::stdString((int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    QAbstractFileEngine::setError
              (in_stack_ffffffffffffff50,(FileError)((ulong)in_stack_ffffffffffffff48 >> 0x20),
               (QString *)in_stack_ffffffffffffff40);
    QString::~QString((QString *)0x12bec3);
    local_48 = -1;
  }
  else {
    local_70 = 0;
    if (in_RDX != 0) {
      if (in_RDI->fh == (FILE *)0x0) {
        if (in_RDI->fd != -1) {
          do {
            std::numeric_limits<long>::max();
            qVar4 = qt_safe_write((int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                  in_stack_ffffffffffffff48,(qint64)in_stack_ffffffffffffff40);
            bVar5 = false;
            if (0 < qVar4) {
              local_70 = qVar4 + local_70;
              bVar5 = local_70 < in_RDX;
            }
          } while (bVar5);
        }
      }
      else {
        do {
          sVar2 = fwrite((void *)(in_RSI + local_70),1,in_RDX - local_70,(FILE *)in_RDI->fh);
          local_70 = sVar2 + local_70;
          if (sVar2 == 0) {
            piVar3 = __errno_location();
            bVar5 = *piVar3 == 4;
          }
          else {
            bVar5 = local_70 < in_RDX;
          }
        } while (bVar5);
      }
    }
    error = (FileError)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    if ((in_RDX == 0) || (local_70 != 0)) {
      flags.i = (Int)((ulong)&in_RDI->metaData >> 0x20);
      QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
                (&in_stack_ffffffffffffff40->knownFlagsMask,in_stack_ffffffffffffff3c);
      QFileSystemMetaData::clearFlags(in_stack_ffffffffffffff40,(MetaDataFlags)flags.i);
    }
    else {
      local_70 = -1;
      __errno_location();
      __errno_location();
      QSystemError::stdString(error);
      QAbstractFileEngine::setError(this_00,error,(QString *)in_stack_ffffffffffffff40);
      QString::~QString((QString *)0x12c0a4);
    }
    local_48 = local_70;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_48;
}

Assistant:

qint64 QFSFileEnginePrivate::writeFdFh(const char *data, qint64 len)
{
    Q_Q(QFSFileEngine);

    if (len < 0 || len != qint64(size_t(len))) {
        q->setError(QFile::WriteError, QSystemError::stdString(EINVAL));
        return -1;
    }

    qint64 writtenBytes = 0;

    if (len) { // avoid passing nullptr to fwrite() or QT_WRITE() (UB)

        if (fh) {
            // Buffered stdlib mode.

            size_t result;
            do {
                result = fwrite(data + writtenBytes, 1, size_t(len - writtenBytes), fh);
                writtenBytes += result;
            } while (result == 0 ? errno == EINTR : writtenBytes < len);

        } else if (fd != -1) {
            // Unbuffered stdio mode.

            SignedIOType result;
            do {
                // calculate the chunk size
                // on Windows or 32-bit no-largefile Unix, we'll need to read in chunks
                // we limit to the size of the signed type, otherwise we could get a negative number as a result
                quint64 wantedBytes = quint64(len) - quint64(writtenBytes);
                UnsignedIOType chunkSize = std::numeric_limits<SignedIOType>::max();
                if (chunkSize > wantedBytes)
                    chunkSize = wantedBytes;
                result = QT_WRITE(fd, data + writtenBytes, chunkSize);
            } while (result > 0 && (writtenBytes += result) < len);
        }

    }

    if (len &&  writtenBytes == 0) {
        writtenBytes = -1;
        q->setError(errno == ENOSPC ? QFile::ResourceError : QFile::WriteError,
                    QSystemError::stdString(errno));
    } else {
        // reset the cached size, if any
        metaData.clearFlags(QFileSystemMetaData::SizeAttribute);
    }

    return writtenBytes;
}